

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

int __thiscall RenX::Server::connect(Server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  ushort uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  size_type sVar6;
  ushort local_80;
  string local_50;
  __sv_type local_30;
  rep local_20;
  Server *local_18;
  Server *this_local;
  
  local_18 = this;
  local_20 = std::chrono::_V2::steady_clock::now();
  (this->m_lastAttempt).__d.__r = local_20;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->m_hostname);
  uVar1 = this->m_port;
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->m_clientHostname);
  if (bVar2) {
    local_80 = 0;
  }
  else {
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->m_clientHostname);
    local_80 = (ushort)pcVar4;
  }
  uVar5 = Jupiter::Socket::connect
                    ((char *)&this->m_sock,(ushort)pcVar3,(char *)(ulong)uVar1,local_80);
  bVar2 = (uVar5 & 1) != 0;
  if (bVar2) {
    Jupiter::Socket::setBlocking((bool)((char)this + '`'));
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&this->m_pass);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&this->m_pass);
    string_printf_abi_cxx11_(&local_50,"a%.*s\n",sVar6,pcVar3);
    local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
    sendSocket(this,local_30);
    std::__cxx11::string::~string((string *)&local_50);
    this->m_connected = true;
    this->m_attempts = 0;
  }
  else {
    this->m_connected = false;
    this->m_attempts = this->m_attempts + 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),bVar2);
}

Assistant:

bool RenX::Server::connect() {
	m_lastAttempt = std::chrono::steady_clock::now();
	if (m_sock.connect(m_hostname.c_str(), m_port, m_clientHostname.empty() ? nullptr : m_clientHostname.c_str()))
	{
		m_sock.setBlocking(false);
		sendSocket(string_printf("a%.*s\n", m_pass.size(), m_pass.data()));
		m_connected = true;
		m_attempts = 0;
		return true;
	}
	m_connected = false;
	++m_attempts;
	return false;
}